

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O0

int choose_new_sa(uint64_t name,int sa)

{
  int cnt;
  int j;
  int sa_local;
  uint64_t name_local;
  int local_4;
  
  if (((0xfd < sa) || ((addr[sa].flags & 1U) == 0)) ||
     ((local_4 = sa, addr[sa].name != 0 && ((addr[sa].name != name && (addr[sa].name <= name)))))) {
    for (j = 0; j < 0xfe; j = j + 1) {
      if (((addr[j].flags & 1U) != 0) && ((addr[j].name == 0 || (addr[j].name == name)))) {
        return j;
      }
    }
    j = sa + 1;
    for (cnt = 0; cnt < 0xfe; cnt = cnt + 1) {
      if (0xfd < j) {
        j = 0;
      }
      if (((addr[j].flags & 1U) != 0) && (name < addr[j].name)) {
        return j;
      }
      j = j + 1;
    }
    local_4 = 0xfe;
  }
  return local_4;
}

Assistant:

static int choose_new_sa(uint64_t name, int sa)
{
	int j, cnt;

	/* test current entry */
	if ((sa < J1939_IDLE_ADDR) && (addr[sa].flags & F_USE)) {
		j = sa;
		if (!addr[j].name || (addr[j].name == name) || (addr[j].name > name))
			return j;
	}
	/* take first empty spot */
	for (j = 0; j < J1939_IDLE_ADDR; ++j) {
		if (!(addr[j].flags & F_USE))
			continue;
		if (!addr[j].name || (addr[j].name == name))
			return j;
	}

	/*
	 * no empty spot found
	 * take next (relative to @sa) spot that we can
	 * successfully contest
	 */
	j = sa + 1;
	for (cnt = 0; cnt < J1939_IDLE_ADDR; ++j, ++cnt) {
		if (j >= J1939_IDLE_ADDR)
			j = 0;
		if (!(addr[j].flags & F_USE))
			continue;
		if (name < addr[j].name)
			return j;
	}
	return J1939_IDLE_ADDR;
}